

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O3

Message * __thiscall testing::Message::operator<<(Message *this,wchar_t *wide_c_str)

{
  wchar_t *in_RDX;
  string local_30;
  
  internal::String::ShowWideCString_abi_cxx11_(&local_30,(String *)wide_c_str,in_RDX);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)((this->ss_).ptr_ + 0x10),local_30._M_dataplus._M_p,
             local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return this;
}

Assistant:

Message& Message::operator <<(wchar_t* wide_c_str) {
  return *this << internal::String::ShowWideCString(wide_c_str);
}